

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

uchar * nvpair_unpack_string_array(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  bool bVar1;
  size_t sVar2;
  int *piVar3;
  void *__ptr;
  char *__s;
  size_t sVar4;
  uchar *__string;
  ulong uVar5;
  ulong uVar6;
  
  if (nvp->nvp_type != 10) {
    __assert_fail("nvp->nvp_type == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x3be,
                  "const unsigned char *nvpair_unpack_string_array(_Bool, nvpair_t *, const unsigned char *, size_t *)"
                 );
  }
  sVar4 = nvp->nvp_datasize;
  if ((sVar4 - 1 < *leftp) && (uVar5 = nvp->nvp_nitems, uVar5 != 0)) {
    __string = ptr;
    uVar6 = 1;
    do {
      sVar2 = strnlen((char *)__string,sVar4 - 1);
      sVar4 = sVar4 - (sVar2 + 1);
      if ((long)sVar4 < 0) goto LAB_0010d179;
      __string = __string + sVar2 + 1;
      bVar1 = uVar6 < uVar5;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
    if (sVar4 == 0) {
      __ptr = malloc(uVar5 << 3);
      if (__ptr == (void *)0x0) {
        return (uchar *)0x0;
      }
      if (nvp->nvp_nitems != 0) {
        uVar5 = 0;
        do {
          __s = strdup((char *)ptr);
          *(char **)((long)__ptr + uVar5 * 8) = __s;
          if (__s == (char *)0x0) {
            if ((int)uVar5 != 0) {
              uVar6 = 0;
              do {
                free(*(void **)((long)__ptr + uVar6 * 8));
                uVar6 = uVar6 + 1;
              } while (uVar5 != uVar6);
            }
            free(__ptr);
            return (uchar *)0x0;
          }
          sVar2 = strlen(__s);
          ptr = ptr + sVar2 + 1;
          *leftp = *leftp - (sVar2 + 1);
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (uVar5 < nvp->nvp_nitems);
      }
      nvp->nvp_data = (uint64_t)__ptr;
      return ptr;
    }
  }
LAB_0010d179:
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_string_array(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp)
{
	ssize_t size;
	size_t len;
	const char *tmp;
	char **value;
	unsigned int ii, j;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING_ARRAY);

	if (*leftp < nvp->nvp_datasize || nvp->nvp_datasize == 0 ||
	    nvp->nvp_nitems == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	size = nvp->nvp_datasize;
	tmp = (const char *)ptr;
	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		len = strnlen(tmp, size - 1) + 1;
		size -= len;
		if (size < 0) {
			ERRNO_SET(EINVAL);
			return (NULL);
		}
		tmp += len;
	}
	if (size != 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(sizeof(*value) * nvp->nvp_nitems);
	if (value == NULL)
		return (NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		value[ii] = nv_strdup((const char *)ptr);
		if (value[ii] == NULL)
			goto out;
		len = strlen(value[ii]) + 1;
		ptr += len;
		*leftp -= len;
	}
	nvp->nvp_data = (uint64_t)(uintptr_t)value;

	return (ptr);
out:
	for (j = 0; j < ii; j++)
		nv_free(value[j]);
	nv_free(value);
	return (NULL);
}